

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O1

void process_data_simple_main
               (j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
               JDIMENSION in_rows_avail)

{
  JDIMENSION *pJVar1;
  jpeg_c_main_controller *pjVar2;
  boolean bVar3;
  uint uVar4;
  
  pjVar2 = cinfo->main;
  if (*(uint *)&pjVar2[1].start_pass < cinfo->total_iMCU_rows) {
    pJVar1 = (JDIMENSION *)((long)&pjVar2[1].start_pass + 4);
    do {
      if (*pJVar1 < (uint)cinfo->min_DCT_v_scaled_size) {
        (*cinfo->prep->pre_process_data)
                  (cinfo,input_buf,in_row_ctr,in_rows_avail,(JSAMPIMAGE)(pjVar2 + 2),pJVar1,
                   cinfo->min_DCT_v_scaled_size);
      }
      if (*pJVar1 != cinfo->min_DCT_v_scaled_size) {
        return;
      }
      bVar3 = (*cinfo->coef->compress_data)(cinfo,(JSAMPIMAGE)(pjVar2 + 2));
      if (bVar3 == 0) {
        if (*(int *)&pjVar2[1].process_data != 0) {
          return;
        }
        *in_row_ctr = *in_row_ctr - 1;
        *(undefined4 *)&pjVar2[1].process_data = 1;
        return;
      }
      if (*(int *)&pjVar2[1].process_data != 0) {
        *in_row_ctr = *in_row_ctr + 1;
        *(undefined4 *)&pjVar2[1].process_data = 0;
      }
      *(undefined4 *)((long)&pjVar2[1].start_pass + 4) = 0;
      uVar4 = *(int *)&pjVar2[1].start_pass + 1;
      *(uint *)&pjVar2[1].start_pass = uVar4;
    } while (uVar4 < cinfo->total_iMCU_rows);
  }
  return;
}

Assistant:

METHODDEF(void)
process_data_simple_main (j_compress_ptr cinfo,
			  JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
			  JDIMENSION in_rows_avail)
{
  my_main_ptr main = (my_main_ptr) cinfo->main;

  while (main->cur_iMCU_row < cinfo->total_iMCU_rows) {
    /* Read input data if we haven't filled the main buffer yet */
    if (main->rowgroup_ctr < (JDIMENSION) cinfo->min_DCT_v_scaled_size)
      (*cinfo->prep->pre_process_data) (cinfo,
					input_buf, in_row_ctr, in_rows_avail,
					main->buffer, &main->rowgroup_ctr,
					(JDIMENSION) cinfo->min_DCT_v_scaled_size);

    /* If we don't have a full iMCU row buffered, return to application for
     * more data.  Note that preprocessor will always pad to fill the iMCU row
     * at the bottom of the image.
     */
    if (main->rowgroup_ctr != (JDIMENSION) cinfo->min_DCT_v_scaled_size)
      return;

    /* Send the completed row to the compressor */
    if (! (*cinfo->coef->compress_data) (cinfo, main->buffer)) {
      /* If compressor did not consume the whole row, then we must need to
       * suspend processing and return to the application.  In this situation
       * we pretend we didn't yet consume the last input row; otherwise, if
       * it happened to be the last row of the image, the application would
       * think we were done.
       */
      if (! main->suspended) {
	(*in_row_ctr)--;
	main->suspended = TRUE;
      }
      return;
    }
    /* We did finish the row.  Undo our little suspension hack if a previous
     * call suspended; then mark the main buffer empty.
     */
    if (main->suspended) {
      (*in_row_ctr)++;
      main->suspended = FALSE;
    }
    main->rowgroup_ctr = 0;
    main->cur_iMCU_row++;
  }
}